

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O2

void __thiscall
soplex::SPxWeightST<double>::generate(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  DataArray<int> *this_00;
  Array<double> *this_01;
  Array<double> *this_02;
  double *pdVar1;
  double dVar2;
  double dVar3;
  SVSetBase<double> *pSVar4;
  int *piVar5;
  Array<double> *pAVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  DataKey DVar14;
  SVectorBase<double> *this_03;
  Nonzero<double> *pNVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  Array<double> *pAVar21;
  int iVar22;
  bool bVar23;
  Real RVar24;
  double local_130;
  ulong local_128;
  DataArray<soplex::SPxId> pref;
  DataArray<int> row;
  SPxId tmpId;
  DataArray<int> col;
  Compare<double> local_90;
  Desc desc;
  
  tmpId.super_DataKey.info = 0;
  tmpId.super_DataKey.idx = -1;
  this_00 = &this->forbidden;
  DataArray<int>::reSize(this_00,(base->thecovectors->set).thenum);
  this_01 = &this->rowWeight;
  Array<double>::reSize
            (this_01,(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  this_02 = &this->colWeight;
  Array<double>::reSize
            (this_02,(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  DataArray<bool>::reSize
            (&this->rowRight,
             (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  DataArray<bool>::reSize
            (&this->colUp,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  pAVar21 = this_02;
  pAVar6 = this_01;
  if (base->theRep == COLUMN) {
    pAVar21 = this_01;
    pAVar6 = this_02;
  }
  this->weight = pAVar6;
  this->coWeight = pAVar21;
  (*(this->super_SPxStarter<double>)._vptr_SPxStarter[8])(this,base);
  SPxBasisBase<double>::Desc::Desc(&desc,base);
  DataArray<soplex::SPxId>::DataArray
            (&pref,(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum +
                   (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum,0,1.2);
  DataArray<int>::DataArray
            (&row,(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                  .set.thenum,0,1.2);
  DataArray<int>::DataArray
            (&col,(base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>
                  .set.thenum,0,1.2);
  for (lVar11 = 0;
      lVar11 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum; lVar11 = lVar11 + 1) {
    row.data[lVar11] = (int)lVar11;
  }
  local_90.weight =
       (this_01->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<double>>(row.data,row.thesize,&local_90,0,true);
  for (lVar11 = 0;
      lVar11 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum; lVar11 = lVar11 + 1) {
    col.data[lVar11] = (int)lVar11;
  }
  local_90.weight =
       (this_02->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar20 = 0;
  SPxQuicksort<int,soplex::Compare<double>>(col.data,col.thesize,&local_90,0,true);
  uVar17 = 0;
  uVar13 = 0;
LAB_001c8198:
  do {
    iVar19 = (int)uVar20;
    uVar20 = (ulong)iVar19;
    iVar18 = (int)uVar17;
    iVar22 = (int)uVar13;
    uVar12 = (ulong)iVar22;
    uVar16 = uVar13 & 0xffffffff;
    lVar11 = 0;
    uVar13 = uVar12;
    do {
      uVar13 = uVar13 + 1;
      if (pref.thesize <= iVar22 + (int)lVar11) {
        DataArray<int>::~DataArray(&col);
        DataArray<int>::~DataArray(&row);
        pSVar4 = base->thecovectors;
        piVar5 = (this->forbidden).data;
        for (lVar11 = 0; local_128 = (ulong)(pSVar4->set).thenum, lVar11 < (long)local_128;
            lVar11 = lVar11 + 1) {
          piVar5[lVar11] = 0;
        }
        uVar17 = 0;
        bVar23 = base->theRep == COLUMN;
        iVar18 = (bVar23 - 1) + (uint)bVar23;
        if (!bVar23) {
          uVar17 = (ulong)(pref.thesize - 1);
        }
        uVar7 = ((int)uVar17 + (uint)bVar23 * 2) - 1;
        local_130 = 0.0;
        do {
          iVar19 = (int)uVar17;
          if ((iVar19 < 0) || (pref.thesize <= iVar19)) {
LAB_001c8772:
            (*(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(base,&desc);
            DataArray<soplex::SPxId>::~DataArray(&pref);
            SPxBasisBase<double>::Desc::~Desc(&desc);
            return;
          }
          tmpId.super_DataKey = pref.data[uVar17].super_DataKey;
          this_03 = SPxSolverBase<double>::vector(base,&tmpId);
          if (this_03->memused != 1) {
            local_130 = SVectorBase<double>::maxAbs(this_03);
            uVar13 = (ulong)(uint)this_03->memused;
            uVar20 = 0xffffffff;
            iVar22 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum;
            do {
              iVar9 = (int)uVar13 + 1;
              pNVar15 = this_03->m_elem + uVar13;
              do {
                iVar9 = iVar9 + -1;
                if (iVar9 < 1) goto LAB_001c8506;
                uVar13 = uVar13 - 1;
                uVar10 = pNVar15[-1].idx;
                pNVar15 = pNVar15 + -1;
              } while ((this->forbidden).data[(int)uVar10] != 0);
              iVar9 = (base->thecovectors->set).theitem
                      [(base->thecovectors->set).thekey[(int)uVar10].idx].data.
                      super_SVectorBase<double>.memused;
              dVar2 = pNVar15->val;
              iVar8 = (*(this->super_SPxStarter<double>)._vptr_SPxStarter[6])(this);
              dVar3 = *(double *)(*(long *)CONCAT44(extraout_var,iVar8) + 0x40);
              uVar12 = -(ulong)(dVar3 == 1.0);
              if ((double)(~uVar12 & (ulong)(dVar3 * 0.001) | uVar12 & 0x3f50624dd2f1a9fc) *
                  local_130 < ABS(dVar2) && iVar9 < iVar22) {
                uVar20 = (ulong)uVar10;
                iVar22 = iVar9;
              }
            } while( true );
          }
          uVar20 = (ulong)this_03->m_elem->idx;
          iVar22 = (this->forbidden).data[uVar20];
          if (iVar22 < 2) {
            local_128 = (ulong)((int)local_128 + (uint)(iVar22 == 1));
LAB_001c8506:
            if (-1 < (int)uVar20) {
              (this->forbidden).data[uVar20 & 0xffffffff] = 2;
              if (base->theRep == COLUMN) {
                setDualStatus<double>(&desc,base,pref.data + uVar17);
              }
              else {
                setPrimalStatus(this,&desc,base,pref.data + uVar17);
              }
              uVar17 = (ulong)(uint)this_03->memused;
              do {
                uVar13 = uVar17 & 0xffffffff;
                lVar11 = uVar17 * 0x10 + -8;
                while( true ) {
                  uVar17 = uVar17 - 1;
                  if ((int)uVar13 < 1) {
                    uVar10 = (int)local_128 - 1;
                    local_128 = (ulong)uVar10;
                    if (uVar10 == 0) {
                      if (base->theRep == COLUMN) {
                        for (; (-1 < (int)uVar7 && ((int)uVar7 < pref.thesize));
                            uVar7 = uVar7 + iVar18) {
                          setPrimalStatus(this,&desc,base,pref.data + uVar7);
                        }
                        uVar7 = this_00->thesize;
                        while (0 < (int)uVar7) {
                          uVar7 = uVar7 - 1;
                          if ((this->forbidden).data[uVar7] < 2) {
                            row._0_8_ = SPxSolverBase<double>::coId(base,uVar7);
                            setDualStatus<double>(&desc,base,(SPxId *)&row);
                          }
                        }
                      }
                      else {
                        for (; (-1 < (int)uVar7 && ((int)uVar7 < pref.thesize));
                            uVar7 = uVar7 + iVar18) {
                          setDualStatus<double>(&desc,base,pref.data + uVar7);
                        }
                        uVar7 = this_00->thesize;
                        while (0 < (int)uVar7) {
                          uVar7 = uVar7 - 1;
                          if ((this->forbidden).data[uVar7] < 2) {
                            row._0_8_ = SPxSolverBase<double>::coId(base,uVar7);
                            setPrimalStatus(this,&desc,base,(SPxId *)&row);
                          }
                        }
                      }
                      goto LAB_001c8772;
                    }
                    goto LAB_001c864a;
                  }
                  dVar2 = *(double *)((long)this_03->m_elem + lVar11 + -8);
                  iVar22 = *(int *)((long)&this_03->m_elem->val + lVar11);
                  iVar9 = (*(this->super_SPxStarter<double>)._vptr_SPxStarter[6])(this);
                  RVar24 = Tolerances::floatingPointFeastol
                                     (*(Tolerances **)CONCAT44(extraout_var_00,iVar9));
                  piVar5 = (this->forbidden).data;
                  if ((piVar5[iVar22] == 0) &&
                     ((RVar24 * local_130 < dVar2 || (RVar24 * local_130 < -dVar2)))) break;
                  uVar13 = (ulong)((int)uVar13 - 1);
                  lVar11 = lVar11 + -0x10;
                }
                piVar5[iVar22] = 1;
                local_128 = (ulong)((int)local_128 - 1);
              } while( true );
            }
          }
          if (base->theRep == COLUMN) {
            setPrimalStatus(this,&desc,base,pref.data + uVar17);
          }
          else {
            setDualStatus<double>(&desc,base,pref.data + uVar17);
          }
LAB_001c864a:
          uVar17 = (ulong)(uint)(iVar19 + iVar18);
          uVar7 = uVar7 + iVar18;
        } while( true );
      }
      dVar2 = (this_02->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[col.data[iVar18 + lVar11]];
      pdVar1 = (this_01->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + row.data[uVar20];
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        DVar14 = (DataKey)SPxLPBase<double>::rId(&base->super_SPxLPBase<double>,row.data[uVar20]);
        pref.data[iVar22 + lVar11].super_DataKey = DVar14;
        pref.data[iVar22 + lVar11].super_DataKey.info = -1;
        uVar7 = iVar19 + 1;
        uVar20 = (ulong)uVar7;
        if ((int)uVar7 <
            (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum) {
          uVar17 = (uVar17 & 0xffffffff) + lVar11;
          uVar13 = uVar16 + lVar11 + 1;
        }
        else {
          uVar17 = iVar18 + lVar11;
          for (; (long)uVar13 < (long)pref.thesize; uVar13 = uVar13 + 1) {
            DVar14 = (DataKey)SPxLPBase<double>::cId
                                        (&base->super_SPxLPBase<double>,col.data[uVar17]);
            uVar17 = uVar17 + 1;
            pref.data[uVar13].super_DataKey = DVar14;
            pref.data[uVar13].super_DataKey.info = 1;
          }
        }
        goto LAB_001c8198;
      }
      DVar14 = (DataKey)SPxLPBase<double>::cId
                                  (&base->super_SPxLPBase<double>,col.data[iVar18 + lVar11]);
      pref.data[uVar12 + lVar11].super_DataKey = DVar14;
      pref.data[uVar12 + lVar11].super_DataKey.info = 1;
      lVar11 = lVar11 + 1;
    } while (iVar18 + (int)lVar11 <
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
    uVar17 = (uVar17 & 0xffffffff) + lVar11;
    for (; (long)uVar13 < (long)pref.thesize; uVar13 = uVar13 + 1) {
      DVar14 = (DataKey)SPxLPBase<double>::rId(&base->super_SPxLPBase<double>,row.data[uVar20]);
      uVar20 = uVar20 + 1;
      pref.data[uVar13].super_DataKey = DVar14;
      pref.data[uVar13].super_DataKey.info = -1;
    }
  } while( true );
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}